

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackBackTrace.h
# Opt level: O0

StackBackTrace *
StackBackTrace::Capture<Memory::Recycler>(Recycler *alloc,ULONG framesToSkip,ULONG framesToCapture)

{
  Recycler *alloc_00;
  StackBackTrace *this;
  TrackAllocData local_40;
  ULONG local_18;
  ULONG local_14;
  ULONG framesToCapture_local;
  ULONG framesToSkip_local;
  Recycler *alloc_local;
  
  local_18 = framesToCapture;
  local_14 = framesToSkip;
  _framesToCapture_local = alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,(ulong)framesToCapture << 3,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/StackBackTrace.h"
             ,0x2f);
  alloc_00 = Memory::Recycler::TrackAllocInfo(alloc,&local_40);
  this = (StackBackTrace *)new<Memory::Recycler>(8,alloc_00,0x473830,0);
  StackBackTrace(this,local_14,local_18);
  return this;
}

Assistant:

StackBackTrace *
StackBackTrace::Capture(TAllocator * alloc, ULONG framesToSkip, ULONG framesToCapture)
{
    return AllocatorNewPlusZ(TAllocator, alloc, sizeof(PVOID) * framesToCapture, StackBackTrace, framesToSkip, framesToCapture);
}